

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::LegacyReporterAdapter::assertionEnded
          (LegacyReporterAdapter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  pointer pMVar3;
  pointer pMVar4;
  IReporter *pIVar5;
  undefined1 local_3b0 [8];
  AssertionResult result;
  string local_2f0 [32];
  undefined1 local_2d0 [8];
  AssertionInfo info;
  undefined1 local_250 [8];
  ExpressionResultBuilder expressionBuilder;
  const_iterator itEnd;
  const_iterator it;
  AssertionStats *assertionStats_local;
  LegacyReporterAdapter *this_local;
  
  OVar2 = AssertionResult::getResultType(&assertionStats->assertionResult);
  if (OVar2 != Ok) {
    itEnd = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                      (&assertionStats->infoMessages);
    expressionBuilder._544_8_ =
         std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                   (&assertionStats->infoMessages);
    while (bVar1 = __gnu_cxx::operator!=
                             (&itEnd,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                      *)&expressionBuilder.field_0x220), bVar1) {
      pMVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator->(&itEnd);
      if (pMVar3->type == Info) {
        pMVar3 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->(&itEnd);
        ExpressionResultBuilder::ExpressionResultBuilder
                  ((ExpressionResultBuilder *)local_250,pMVar3->type);
        pMVar3 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->(&itEnd);
        ExpressionResultBuilder::operator<<((ExpressionResultBuilder *)local_250,&pMVar3->message);
        pMVar3 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->(&itEnd);
        pMVar4 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->(&itEnd);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2f0,"",(allocator *)&result.m_resultData.field_0x47);
        AssertionInfo::AssertionInfo
                  ((AssertionInfo *)local_2d0,&pMVar3->macroName,&pMVar4->lineInfo,
                   (string *)local_2f0,Normal);
        std::__cxx11::string::~string(local_2f0);
        std::allocator<char>::~allocator((allocator<char> *)&result.m_resultData.field_0x47);
        ExpressionResultBuilder::buildResult
                  ((AssertionResult *)local_3b0,(ExpressionResultBuilder *)local_250,
                   (AssertionInfo *)local_2d0);
        pIVar5 = Ptr<Catch::IReporter>::operator->(&this->m_legacyReporter);
        (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar5,local_3b0);
        AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
        AssertionInfo::~AssertionInfo((AssertionInfo *)local_2d0);
        ExpressionResultBuilder::~ExpressionResultBuilder((ExpressionResultBuilder *)local_250);
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
      ::operator++(&itEnd);
    }
  }
  pIVar5 = Ptr<Catch::IReporter>::operator->(&this->m_legacyReporter);
  (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
            (pIVar5,&assertionStats->assertionResult);
  return true;
}

Assistant:

bool LegacyReporterAdapter::assertionEnded( AssertionStats const& assertionStats ) {
        if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
            for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                    it != itEnd;
                    ++it ) {
                if( it->type == ResultWas::Info ) {
                    ExpressionResultBuilder expressionBuilder( it->type );
                        expressionBuilder << it->message;
                    AssertionInfo info( it->macroName, it->lineInfo, "", ResultDisposition::Normal );
                    AssertionResult result = expressionBuilder.buildResult( info );
                    m_legacyReporter->Result( result );
                }
            }
        }
        m_legacyReporter->Result( assertionStats.assertionResult );
        return true;
    }